

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPrimal.cpp
# Opt level: O3

void __thiscall HPrimal::primalUpdate(HPrimal *this)

{
  HVector *this_00;
  double alpha;
  double dVar1;
  double dVar2;
  int iVar3;
  int columnOut;
  uint uVar4;
  HModel *this_01;
  pointer pdVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  bool bVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  pointer pdVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  this_01 = this->model;
  pdVar5 = (this->column).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this_01->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this_01->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this_01->baseLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (this_01->baseUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar13 = this->columnIn;
  iVar3 = piVar6[iVar13];
  iVar15 = this->rowOut;
  alpha = pdVar5[iVar15];
  pdVar17 = pdVar9;
  if (0.0 < (double)iVar3 * alpha) {
    pdVar17 = pdVar8;
  }
  pdVar10 = (this_01->baseValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  columnOut = (this_01->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar15];
  dVar19 = (this_01->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar13];
  dVar1 = (this_01->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar13];
  pdVar11 = (this_01->workValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar2 = this_01->dblOption[1];
  dVar20 = (pdVar10[iVar15] - pdVar17[iVar15]) / alpha;
  dVar21 = pdVar11[iVar13] + dVar20;
  if (iVar3 == -1) {
    if (dVar19 - dVar2 <= dVar21) goto LAB_001328e4;
    pdVar11[iVar13] = dVar19;
    dVar20 = dVar19 - dVar1;
    iVar15 = 1;
  }
  else {
    if ((iVar3 != 1) || (dVar21 <= dVar2 + dVar1)) {
LAB_001328e4:
      bVar12 = false;
      goto LAB_001328e6;
    }
    pdVar11[iVar13] = dVar1;
    dVar20 = dVar1 - dVar19;
    iVar15 = -1;
  }
  piVar6[iVar13] = iVar15;
  bVar12 = true;
LAB_001328e6:
  lVar14 = (long)(this->column).count;
  if (0 < lVar14) {
    piVar6 = (this->column).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar16 = 0;
    do {
      iVar13 = piVar6[lVar16];
      pdVar10[iVar13] = pdVar5[iVar13] * -dVar20 + pdVar10[iVar13];
      lVar16 = lVar16 + 1;
    } while (lVar14 != lVar16);
  }
  if (!bVar12) {
    HModel::updatePivots
              (this_01,this->columnIn,this->rowOut,(uint)((double)iVar3 * alpha <= 0.0) * 2 + -1);
    pdVar10[this->rowOut] = dVar21;
    if (0 < (long)this->numRow) {
      lVar14 = 0;
      do {
        if ((pdVar10[lVar14] < pdVar8[lVar14] - dVar2) || (pdVar9[lVar14] + dVar2 < pdVar10[lVar14])
           ) {
          this->invertHint = 7;
        }
        lVar14 = lVar14 + 1;
      } while (this->numRow != lVar14);
    }
    this_00 = &this->row_ep;
    HVector::clear(this_00);
    HVector::clear(&this->row_ap);
    (this->row_ep).count = 1;
    iVar13 = this->rowOut;
    *(this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start = iVar13;
    (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar13] = 1.0;
    (this->row_ep).packFlag = true;
    HFactor::btran(&this->model->factor,this_00,this->row_epDensity);
    HMatrix::price_by_row(&this->model->matrix,&this->row_ap,this_00);
    uVar4 = (this->row_ep).count;
    this->row_epDensity =
         this->row_epDensity * 0.95 + ((double)(int)uVar4 * 0.05) / (double)this->numRow;
    iVar13 = this->columnIn;
    dVar19 = pdVar7[iVar13] / alpha;
    lVar14 = (long)(this->row_ap).count;
    if (0 < lVar14) {
      piVar6 = (this->row_ap).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->row_ap).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar16 = 0;
      do {
        iVar3 = piVar6[lVar16];
        pdVar7[iVar3] = pdVar5[iVar3] * -dVar19 + pdVar7[iVar3];
        lVar16 = lVar16 + 1;
      } while (lVar14 != lVar16);
    }
    if (0 < (int)uVar4) {
      piVar6 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = this->numCol;
      uVar18 = 0;
      do {
        lVar16 = (long)piVar6[uVar18];
        lVar14 = iVar3 + lVar16;
        pdVar7[lVar14] = pdVar5[lVar16] * -dVar19 + pdVar7[lVar14];
        uVar18 = uVar18 + 1;
      } while (uVar4 != uVar18);
    }
    pdVar7[iVar13] = 0.0;
    pdVar7[columnOut] = -dVar19;
    HModel::updateFactor(this->model,&this->column,this_00,&this->rowOut,&this->invertHint);
    HModel::updateMatrix(this->model,this->columnIn,columnOut);
    iVar13 = this->countUpdate + 1;
    this->countUpdate = iVar13;
    if (this->limitUpdate <= iVar13) {
      this->invertHint = 1;
    }
    HModel::recordPivots(this->model,this->columnIn,columnOut,alpha);
    return;
  }
  return;
}

Assistant:

void HPrimal::primalUpdate() {
    int *jMove = model->getNonbasicMove();
    double *workDual = model->getWorkDual();
    const double *workLower = model->getWorkLower();
    const double *workUpper = model->getWorkUpper();
    const double *baseLower = model->getBaseLower();
    const double *baseUpper = model->getBaseUpper();
    double *workValue = model->getWorkValue();
    double *baseValue = model->getBaseValue();
    const double primalTolerance = model->dblOption[DBLOPT_PRIMAL_TOL];

    // Compute thetaPrimal
    int moveIn = jMove[columnIn];
    int columnOut = model->getBaseIndex()[rowOut];
    double alpha = column.array[rowOut];
    double thetaPrimal = 0;
    if (alpha * moveIn > 0) {
        // Lower bound
        thetaPrimal = (baseValue[rowOut] - baseLower[rowOut]) / alpha;
    } else {
        // Upper bound
        thetaPrimal = (baseValue[rowOut] - baseUpper[rowOut]) / alpha;
    }

    // 1. Make sure it is inside bounds or just flip bound
    double lowerIn = workLower[columnIn];
    double upperIn = workUpper[columnIn];
    double valueIn = workValue[columnIn] + thetaPrimal;
    bool flipped = false;
    if (jMove[columnIn] == 1) {
        if (valueIn > upperIn + primalTolerance) {
            // Flip to upper
            workValue[columnIn] = upperIn;
            thetaPrimal = upperIn - lowerIn;
            flipped = true;
            jMove[columnIn] = -1;
        }
    } else if (jMove[columnIn] == -1) {
        if (valueIn < lowerIn - primalTolerance) {
            // Flip to lower
            workValue[columnIn] = lowerIn;
            thetaPrimal = lowerIn - upperIn;
            flipped = true;
            jMove[columnIn] = 1;
        }
    }

    for (int i = 0; i < column.count; i++) {
        int index = column.index[i];
        baseValue[index] -= thetaPrimal * column.array[index];
    }

    // If flipped, then no need touch the pivots
    if (flipped) {
        return;
    }

    // Pivot in
    int sourceOut = alpha * moveIn > 0 ? -1 : 1;
    model->updatePivots(columnIn, rowOut, sourceOut);

    baseValue[rowOut] = valueIn;

    // Check for any possible infeasible
    for (int iRow = 0; iRow < numRow; iRow++) {
        if (baseValue[iRow] < baseLower[iRow] - primalTolerance) {
	  invertHint = invertHint_primalInfeasibleInPrimalSimplex; //Was 1
        } else if (baseValue[iRow] > baseUpper[iRow] + primalTolerance) {
	  invertHint = invertHint_primalInfeasibleInPrimalSimplex; //Was 1
        }
    }

    // 2. Now we can update the dual
    row_ep.clear();
    row_ap.clear();
    row_ep.count = 1;
    row_ep.index[0] = rowOut;
    row_ep.array[rowOut] = 1;
    row_ep.packFlag = true;
    model->getFactor()->btran(row_ep, row_epDensity);
    model->getMatrix()->price_by_row(row_ap, row_ep);
    row_epDensity = 0.95 * row_epDensity + 0.05 * row_ep.count / numRow;

    double thetaDual = workDual[columnIn] / alpha;
    for (int i = 0; i < row_ap.count; i++) {
        int iCol = row_ap.index[i];
        workDual[iCol] -= thetaDual * row_ap.array[iCol];
    }
    for (int i = 0; i < row_ep.count; i++) {
        int iGet = row_ep.index[i];
        int iCol = iGet + numCol;
        workDual[iCol] -= thetaDual * row_ep.array[iGet];
    }

    // Dual for the pivot
    workDual[columnIn] = 0;
    workDual[columnOut] = -thetaDual;

    // Update model->factor basis
    model->updateFactor(&column, &row_ep, &rowOut, &invertHint);
    model->updateMatrix(columnIn, columnOut);
    if (++countUpdate >= limitUpdate)
      invertHint = invertHint_updateLimitReached; // Was true;

    model->recordPivots(columnIn, columnOut, alpha);
}